

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
** __thiscall
phmap::priv::
btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
::mutable_child(btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
                *this,size_type i)

{
  bool bVar1;
  size_t sVar2;
  LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>_*,_unsigned_char,_phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>_*>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
  local_30;
  
  bVar1 = leaf(this);
  if (bVar1) {
    __assert_fail("N < 3 || !leaf()",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0x47c,
                  "typename layout_type::template ElementType<N> *phmap::priv::btree_node<phmap::priv::set_params<phmap::priv::(anonymous namespace)::InsertMultiHintData, phmap::priv::(anonymous namespace)::InsertMultiHintDataKeyCompare, std::allocator<phmap::priv::(anonymous namespace)::InsertMultiHintData>, 256, true>>::GetField() [Params = phmap::priv::set_params<phmap::priv::(anonymous namespace)::InsertMultiHintData, phmap::priv::(anonymous namespace)::InsertMultiHintDataKeyCompare, std::allocator<phmap::priv::(anonymous namespace)::InsertMultiHintData>, 256, true>, N = 3UL]"
                 );
  }
  local_30.size_[0] = 1;
  local_30.size_[1] = 4;
  local_30.size_[2] = 0x1e;
  local_30.size_[3] = 0x1f;
  if (((ulong)this & 7) == 0) {
    sVar2 = internal_layout::
            LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>_*,_unsigned_char,_phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>_*>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
            ::Offset<3UL,_0>(&local_30);
    return (btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
            **)(this + i * 8 + sVar2);
  }
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                ,0xf84,
                "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<phmap::priv::(anonymous namespace)::InsertMultiHintData, phmap::priv::(anonymous namespace)::InsertMultiHintDataKeyCompare, std::allocator<phmap::priv::(anonymous namespace)::InsertMultiHintData>, 256, true>> *, unsigned char, phmap::priv::(anonymous namespace)::InsertMultiHintData, phmap::priv::btree_node<phmap::priv::set_params<phmap::priv::(anonymous namespace)::InsertMultiHintData, phmap::priv::(anonymous namespace)::InsertMultiHintDataKeyCompare, std::allocator<phmap::priv::(anonymous namespace)::InsertMultiHintData>, 256, true>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<phmap::priv::(anonymous namespace)::InsertMultiHintData, phmap::priv::(anonymous namespace)::InsertMultiHintDataKeyCompare, std::allocator<phmap::priv::(anonymous namespace)::InsertMultiHintData>, 256, true>> *, unsigned char, phmap::priv::(anonymous namespace)::InsertMultiHintData, phmap::priv::btree_node<phmap::priv::set_params<phmap::priv::(anonymous namespace)::InsertMultiHintData, phmap::priv::(anonymous namespace)::InsertMultiHintDataKeyCompare, std::allocator<phmap::priv::(anonymous namespace)::InsertMultiHintData>, 256, true>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 3UL, Char = char]"
               );
}

Assistant:

btree_node *&mutable_child(size_type i) { return GetField<3>()[i]; }